

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<float,_sptk::int24_t>::Run
          (DataTransform<float,_sptk::int24_t> *this,istream *input_stream)

{
  byte bVar1;
  byte bVar2;
  NumericType NVar3;
  WarningType WVar4;
  float fVar5;
  char *__nptr;
  bool bVar6;
  int *piVar7;
  undefined8 uVar8;
  ostream *poVar9;
  size_t sVar10;
  byte bVar11;
  uint8_t uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  float input_data;
  string word;
  char buffer [128];
  int24_t local_27e;
  int24_t local_27b;
  ulong local_278;
  float local_270;
  uint local_26c;
  uint local_268;
  float local_264;
  istream *local_260;
  string local_258;
  string *local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_238 = &this->print_format_;
  local_278 = 0;
  local_260 = input_stream;
  do {
    if (this->is_ascii_input_ == true) {
      local_228 = 0;
      local_220[0] = '\0';
      local_230 = local_220;
      std::operator>>(local_260,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        iVar18 = 2;
        bVar6 = false;
      }
      else {
        piVar7 = __errno_location();
        iVar18 = *piVar7;
        *piVar7 = 0;
        strtold(__nptr,(char **)&local_258);
        if (local_258._M_dataplus._M_p == __nptr) {
          uVar8 = std::__throw_invalid_argument("stold");
LAB_0013d986:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar8);
        }
        if (*piVar7 == 0) {
          *piVar7 = iVar18;
        }
        else if (*piVar7 == 0x22) {
          uVar8 = std::__throw_out_of_range("stold");
          goto LAB_0013d986;
        }
        local_270 = (float)in_ST0;
        iVar18 = 0;
        bVar6 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar6) {
LAB_0013d4f8:
        bVar1 = (this->minimum_value_).value[2];
        uVar14 = (uint)bVar1 * 0x10000;
        if ((char)bVar1 < '\0') {
          uVar16 = (*(ushort *)(this->minimum_value_).value + uVar14) - 0x1000000;
        }
        else {
          uVar16 = *(ushort *)(this->minimum_value_).value | uVar14;
        }
        bVar2 = (this->maximum_value_).value[2];
        uVar13 = (uint)bVar2 * 0x10000;
        if ((char)bVar2 < '\0') {
          uVar17 = (*(ushort *)(this->maximum_value_).value + uVar13) - 0x1000000;
        }
        else {
          uVar17 = *(ushort *)(this->maximum_value_).value | uVar13;
        }
        uVar19 = (uint)local_270;
        uVar12 = (uint8_t)(uVar19 >> 8);
        bVar11 = (byte)(uVar19 >> 0x10);
        bVar6 = true;
        if ((int)uVar16 < (int)uVar17) {
          NVar3 = this->input_numeric_type_;
          if (NVar3 == kFloatingPoint) {
            local_264 = local_270;
            if ((char)bVar1 < '\0') {
              local_268 = (*(ushort *)(this->minimum_value_).value + uVar14) - 0x1000000;
            }
            else {
              local_268 = *(ushort *)(this->minimum_value_).value | uVar14;
            }
            in_ST6 = in_ST5;
            in_ST7 = in_ST5;
            if ((float)(int)local_268 <= local_270) {
              if ((char)bVar2 < '\0') {
                local_26c = (*(ushort *)(this->maximum_value_).value + uVar13) - 0x1000000;
              }
              else {
                local_26c = *(ushort *)(this->maximum_value_).value | uVar13;
              }
              if ((float)(int)local_26c < local_270) {
LAB_0013d690:
                uVar19 = (uint)(this->maximum_value_).value[0];
                uVar12 = (this->maximum_value_).value[1];
                bVar6 = false;
                bVar11 = bVar2;
              }
            }
            else {
LAB_0013d659:
              uVar19 = (uint)(this->minimum_value_).value[0];
              uVar12 = (this->minimum_value_).value[1];
              bVar6 = false;
              bVar11 = bVar1;
            }
          }
          else if (NVar3 == kUnsignedInteger) {
            if ((char)bVar1 < '\0') {
              uVar14 = (*(ushort *)(this->minimum_value_).value + uVar14) - 0x1000000;
            }
            else {
              uVar14 = *(ushort *)(this->minimum_value_).value | uVar14;
            }
            uVar15 = (long)(local_270 - 9.223372e+18) & (long)local_270 >> 0x3f | (long)local_270;
            if (uVar15 < (ulong)(long)(int)uVar14) goto LAB_0013d659;
            if ((char)bVar2 < '\0') {
              uVar13 = (*(ushort *)(this->maximum_value_).value + uVar13) - 0x1000000;
            }
            else {
              uVar13 = *(ushort *)(this->maximum_value_).value | uVar13;
            }
            if ((ulong)(long)(int)uVar13 < uVar15) goto LAB_0013d690;
          }
          else if (NVar3 == kSignedInteger) {
            if ((char)bVar1 < '\0') {
              uVar14 = (*(ushort *)(this->minimum_value_).value + uVar14) - 0x1000000;
            }
            else {
              uVar14 = *(ushort *)(this->minimum_value_).value | uVar14;
            }
            if ((long)local_270 < (long)(int)uVar14) goto LAB_0013d659;
            if ((char)bVar2 < '\0') {
              uVar13 = (*(ushort *)(this->maximum_value_).value + uVar13) - 0x1000000;
            }
            else {
              uVar13 = *(ushort *)(this->maximum_value_).value | uVar13;
            }
            if ((long)(int)uVar13 < (long)local_270) goto LAB_0013d690;
          }
        }
        if ((bVar6) && (this->rounding_ != false)) {
          if (local_270 <= 0.0) {
            fVar5 = local_270 + -0.5;
          }
          else {
            fVar5 = local_270 + 0.5;
          }
          uVar19 = (uint)fVar5;
          uVar12 = (uint8_t)(uVar19 >> 8);
          bVar11 = (byte)(uVar19 >> 0x10);
        }
        if (!(bool)(bVar6 | this->warning_type_ == kIgnore)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_230,(int)local_278);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"th data is over the range of output type",0x28);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"x2x","");
          sptk::PrintErrorMessage(&local_258,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          WVar4 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          iVar18 = 1;
          if (WVar4 == kExit) goto LAB_0013d87f;
        }
        if (this->is_ascii_output_ == true) {
          local_27b.value[0] = (uint8_t)uVar19;
          local_27b.value[1] = uVar12;
          local_27b.value[2] = bVar11;
          bVar6 = sptk::SnPrintf<sptk::int24_t>(&local_27b,local_238,0x80,local_b8);
          iVar18 = 1;
          if (bVar6) {
            sVar10 = strlen(local_b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,local_b8,sVar10);
            if (((int)local_278 + 1) % this->num_column_ == 0) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
            }
LAB_0013d87c:
            iVar18 = 0;
          }
        }
        else {
          local_27e.value[0] = (uint8_t)uVar19;
          local_27e.value[1] = uVar12;
          local_27e.value[2] = bVar11;
          bVar6 = sptk::WriteStream<sptk::int24_t>(&local_27e,(ostream *)&std::cout);
          iVar18 = 1;
          if (bVar6) goto LAB_0013d87c;
        }
      }
    }
    else {
      bVar6 = sptk::ReadStream<float>(&local_270,local_260);
      iVar18 = 2;
      if (bVar6) goto LAB_0013d4f8;
    }
LAB_0013d87f:
    if (iVar18 != 0) {
      if (iVar18 == 2) {
        bVar6 = true;
        if ((this->is_ascii_output_ == true) &&
           ((int)((long)((ulong)(uint)((int)local_278 >> 0x1f) << 0x20 | local_278 & 0xffffffff) %
                 (long)this->num_column_) != 0)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
      }
      else {
        bVar6 = false;
      }
      return bVar6;
    }
    local_278 = (ulong)((int)local_278 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }